

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelDiscrete.cpp
# Opt level: O2

Index __thiscall
TransitionModelDiscrete::SampleSuccessorState
          (TransitionModelDiscrete *this,Index state,Index action)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = rand();
  uVar2 = 0;
  dVar3 = 0.0;
  while( true ) {
    if (this->_m_nrStates <= (int)uVar2) {
      return 0;
    }
    dVar4 = dVar3;
    (*(this->super_TransitionModelDiscreteInterface).super_TransitionModel._vptr_TransitionModel[4])
              (this,state,(ulong)action,(ulong)uVar2);
    dVar3 = dVar3 + dVar4;
    if ((double)iVar1 * 4.656612873077393e-10 <= dVar3) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

Index TransitionModelDiscrete::SampleSuccessorState(Index state, Index action)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index sucState=0;
    int i;

    for(i=0;i<_m_nrStates;i++)
    {
        sum+=Get(state,action,i);
        if(randNr<=sum)
        {
            sucState=i;
            break;
        }
    }
    return(sucState);
}